

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O2

void __thiscall If_IfElseifElse_Test::TestBody(If_IfElseifElse_Test *this)

{
  uint uVar1;
  AssertionResult *this_00;
  char *pcVar2;
  char *in_R9;
  bool bVar3;
  undefined1 local_178 [8];
  MockParser mock;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertionResult gtest_ar_;
  
  MockParser::MockParser
            ((MockParser *)local_178,
             "let a = 3\nif a == 3 {\n  let b = 4\n} elseif a == 4 {\n  let b = 5\n} else {\n  let b = 6\n}\nlet c = 7\n"
            );
  this_00 = &gtest_ar_;
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  bVar3 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
  local_30.ptr_._0_4_ = CONCAT31(local_30.ptr_._1_3_,bVar3);
  if (!bVar3) {
    testing::Message::Message((Message *)&gtest_ar_.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_50,(internal *)&local_30,
               (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mock.cur_ins,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0x301,(char *)CONCAT71(local_50._1_7_,local_50[0]));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
    goto LAB_001435fb;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this_00);
  uVar1 = *(uint *)(*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
  local_30.ptr_._0_4_ = uVar1 & 0xff;
  gtest_ar_.message_.ptr_._0_4_ = 1;
  mock.cur_fn = mock.cur_fn + 1;
  testing::internal::CmpHelperEQ<BcOp,BcOp>
            ((internal *)local_50,"bc_op(ins)","BC_SET_N",(BcOp *)&local_30,
             (BcOp *)&gtest_ar_.message_);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0x301,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar);
    gtest_ar_.message_.ptr_._0_1_ = (char)(uVar1 >> 8);
    local_30.ptr_._0_4_ = 0;
    testing::internal::CmpHelperEQ<unsigned_char,int>
              ((internal *)local_50,"bc_arg1(ins)","0",(uchar *)&gtest_ar_.message_,(int *)&local_30
              );
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_30);
      if (gtest_ar._0_8_ == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                 ,0x301,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
      gtest_ar_.message_.ptr_._0_2_ = (short)(uVar1 >> 0x10);
      local_30.ptr_._0_4_ = 0;
      testing::internal::CmpHelperEQ<unsigned_short,int>
                ((internal *)local_50,"bc_arg16(ins)","0",(unsigned_short *)&gtest_ar_.message_,
                 (int *)&local_30);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_30);
        if (gtest_ar._0_8_ == 0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                   ,0x301,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar);
        gtest_ar_.success_ = false;
        gtest_ar_._1_7_ = 0;
        bVar3 = mock.cur_fn < (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
        local_30.ptr_._0_4_ = CONCAT31(local_30.ptr_._1_3_,bVar3);
        if (!bVar3) {
          testing::Message::Message((Message *)&gtest_ar_.message_);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_50,(internal *)&local_30,
                     (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                     ,0x303,(char *)CONCAT71(local_50._1_7_,local_50[0]));
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
          goto LAB_001435fb;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)this_00);
        uVar1 = *(uint *)(*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) + mock.cur_fn * 4);
        local_30.ptr_._0_4_ = uVar1 & 0xff;
        gtest_ar_.message_.ptr_._0_4_ = 0x13;
        mock.cur_fn = mock.cur_fn + 1;
        testing::internal::CmpHelperEQ<BcOp,BcOp>
                  ((internal *)local_50,"bc_op(ins)","BC_NEQ_LN",(BcOp *)&local_30,
                   (BcOp *)&gtest_ar_.message_);
        if (local_50[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_30);
          if (gtest_ar._0_8_ == 0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                     ,0x303,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar);
          gtest_ar_.message_.ptr_._0_1_ = (char)(uVar1 >> 8);
          local_30.ptr_._0_4_ = 0;
          testing::internal::CmpHelperEQ<unsigned_char,int>
                    ((internal *)local_50,"bc_arg1(ins)","0",(uchar *)&gtest_ar_.message_,
                     (int *)&local_30);
          if (local_50[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_30);
            if (gtest_ar._0_8_ == 0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                       ,0x303,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
          }
          else {
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&gtest_ar);
            gtest_ar_.message_.ptr_._0_2_ = (short)(uVar1 >> 0x10);
            local_30.ptr_._0_4_ = 0;
            testing::internal::CmpHelperEQ<unsigned_short,int>
                      ((internal *)local_50,"bc_arg16(ins)","0",
                       (unsigned_short *)&gtest_ar_.message_,(int *)&local_30);
            if (local_50[0] == (internal)0x0) {
              testing::Message::Message((Message *)&local_30);
              if (gtest_ar._0_8_ == 0) {
                pcVar2 = "";
              }
              else {
                pcVar2 = *(char **)gtest_ar._0_8_;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                         ,0x303,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&gtest_ar);
              gtest_ar_.success_ = false;
              gtest_ar_._1_7_ = 0;
              bVar3 = mock.cur_fn <
                      (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
              local_30.ptr_._0_4_ = CONCAT31(local_30.ptr_._1_3_,bVar3);
              if (!bVar3) {
                testing::Message::Message((Message *)&gtest_ar_.message_);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)local_50,(internal *)&local_30,
                           (AssertionResult *)"mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count",
                           "false","true",in_R9);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                           ,0x304,(char *)CONCAT71(local_50._1_7_,local_50[0]));
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
LAB_001435fb:
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mock.cur_ins);
                std::__cxx11::string::~string((string *)local_50);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar_.message_);
                goto LAB_0014376a;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)this_00);
              uVar1 = *(uint *)(*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) +
                               mock.cur_fn * 4);
              local_30.ptr_._0_4_ = uVar1 & 0xff;
              gtest_ar_.message_.ptr_._0_4_ = 0x1d;
              mock.cur_fn = mock.cur_fn + 1;
              testing::internal::CmpHelperEQ<BcOp,BcOp>
                        ((internal *)local_50,"bc_op(ins)","BC_JMP",(BcOp *)&local_30,
                         (BcOp *)&gtest_ar_.message_);
              if (local_50[0] == (internal)0x0) {
                testing::Message::Message((Message *)&local_30);
                if (gtest_ar._0_8_ == 0) {
                  pcVar2 = "";
                }
                else {
                  pcVar2 = *(char **)gtest_ar._0_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                           ,0x304,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
              }
              else {
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&gtest_ar);
                local_30.ptr_._0_4_ = uVar1 >> 8;
                gtest_ar_.message_.ptr_._0_4_ = 0x800002;
                testing::internal::CmpHelperEQ<unsigned_int,int>
                          ((internal *)local_50,"bc_arg24(ins)","0x800000 + 3 - 1",(uint *)&local_30
                           ,(int *)&gtest_ar_.message_);
                if (local_50[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_30);
                  if (gtest_ar._0_8_ == 0) {
                    pcVar2 = "";
                  }
                  else {
                    pcVar2 = *(char **)gtest_ar._0_8_;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                             ,0x304,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
                }
                else {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&gtest_ar);
                  gtest_ar_.success_ = false;
                  gtest_ar_._1_7_ = 0;
                  bVar3 = mock.cur_fn <
                          (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18);
                  local_30.ptr_._0_4_ = CONCAT31(local_30.ptr_._1_3_,bVar3);
                  if (!bVar3) {
                    testing::Message::Message((Message *)&gtest_ar_.message_);
                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                              ((string *)local_50,(internal *)&local_30,
                               (AssertionResult *)
                               "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false","true",
                               in_R9);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                               ,0x305,(char *)CONCAT71(local_50._1_7_,local_50[0]));
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
                    goto LAB_001435fb;
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)this_00);
                  uVar1 = *(uint *)(*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) +
                                   mock.cur_fn * 4);
                  local_30.ptr_._0_4_ = uVar1 & 0xff;
                  gtest_ar_.message_.ptr_._0_4_ = 1;
                  mock.cur_fn = mock.cur_fn + 1;
                  testing::internal::CmpHelperEQ<BcOp,BcOp>
                            ((internal *)local_50,"bc_op(ins)","BC_SET_N",(BcOp *)&local_30,
                             (BcOp *)&gtest_ar_.message_);
                  if (local_50[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&local_30);
                    if (gtest_ar._0_8_ == 0) {
                      pcVar2 = "";
                    }
                    else {
                      pcVar2 = *(char **)gtest_ar._0_8_;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                               ,0x305,pcVar2);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
                  }
                  else {
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&gtest_ar);
                    gtest_ar_.message_.ptr_._0_1_ = (char)(uVar1 >> 8);
                    local_30.ptr_._0_4_ = 1;
                    testing::internal::CmpHelperEQ<unsigned_char,int>
                              ((internal *)local_50,"bc_arg1(ins)","1",(uchar *)&gtest_ar_.message_,
                               (int *)&local_30);
                    if (local_50[0] == (internal)0x0) {
                      testing::Message::Message((Message *)&local_30);
                      if (gtest_ar._0_8_ == 0) {
                        pcVar2 = "";
                      }
                      else {
                        pcVar2 = *(char **)gtest_ar._0_8_;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                 ,0x305,pcVar2);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
                    }
                    else {
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&gtest_ar);
                      gtest_ar_.message_.ptr_._0_2_ = (short)(uVar1 >> 0x10);
                      local_30.ptr_._0_4_ = 1;
                      testing::internal::CmpHelperEQ<unsigned_short,int>
                                ((internal *)local_50,"bc_arg16(ins)","1",
                                 (unsigned_short *)&gtest_ar_.message_,(int *)&local_30);
                      if (local_50[0] == (internal)0x0) {
                        testing::Message::Message((Message *)&local_30);
                        if (gtest_ar._0_8_ == 0) {
                          pcVar2 = "";
                        }
                        else {
                          pcVar2 = *(char **)gtest_ar._0_8_;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                   ,0x305,pcVar2);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
                      }
                      else {
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)&gtest_ar);
                        gtest_ar_.success_ = false;
                        gtest_ar_._1_7_ = 0;
                        bVar3 = mock.cur_fn <
                                (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 + mock.vm._264_8_ * 0x18)
                        ;
                        local_30.ptr_._0_4_ = CONCAT31(local_30.ptr_._1_3_,bVar3);
                        if (!bVar3) {
                          testing::Message::Message((Message *)&gtest_ar_.message_);
                          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                    ((string *)local_50,(internal *)&local_30,
                                     (AssertionResult *)
                                     "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false",
                                     "true",in_R9);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                     ,0x306,(char *)CONCAT71(local_50._1_7_,local_50[0]));
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&mock.cur_ins,(Message *)&gtest_ar_.message_);
                          goto LAB_001435fb;
                        }
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       *)this_00);
                        uVar1 = *(uint *)(*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18) +
                                         mock.cur_fn * 4);
                        local_30.ptr_._0_4_ = uVar1 & 0xff;
                        gtest_ar_.message_.ptr_._0_4_ = 0x1d;
                        mock.cur_fn = mock.cur_fn + 1;
                        testing::internal::CmpHelperEQ<BcOp,BcOp>
                                  ((internal *)local_50,"bc_op(ins)","BC_JMP",(BcOp *)&local_30,
                                   (BcOp *)&gtest_ar_.message_);
                        if (local_50[0] == (internal)0x0) {
                          testing::Message::Message((Message *)&local_30);
                          if (gtest_ar._0_8_ == 0) {
                            pcVar2 = "";
                          }
                          else {
                            pcVar2 = *(char **)gtest_ar._0_8_;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                     ,0x306,pcVar2);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
                        }
                        else {
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         *)&gtest_ar);
                          local_30.ptr_._0_4_ = uVar1 >> 8;
                          gtest_ar_.message_.ptr_._0_4_ = 0x800005;
                          testing::internal::CmpHelperEQ<unsigned_int,int>
                                    ((internal *)local_50,"bc_arg24(ins)","0x800000 + 6 - 1",
                                     (uint *)&local_30,(int *)&gtest_ar_.message_);
                          if (local_50[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&local_30);
                            if (gtest_ar._0_8_ == 0) {
                              pcVar2 = "";
                            }
                            else {
                              pcVar2 = *(char **)gtest_ar._0_8_;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                       "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                       ,0x306,pcVar2);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
                          }
                          else {
                            testing::internal::
                            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)&gtest_ar);
                            gtest_ar_.success_ = false;
                            gtest_ar_._1_7_ = 0;
                            bVar3 = mock.cur_fn <
                                    (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 +
                                                         mock.vm._264_8_ * 0x18);
                            local_30.ptr_._0_4_ = CONCAT31(local_30.ptr_._1_3_,bVar3);
                            if (!bVar3) {
                              testing::Message::Message((Message *)&gtest_ar_.message_);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)local_50,(internal *)&local_30,
                                         (AssertionResult *)
                                         "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count","false"
                                         ,"true",in_R9);
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                         ,0x307,(char *)CONCAT71(local_50._1_7_,local_50[0]));
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&mock.cur_ins,
                                         (Message *)&gtest_ar_.message_);
                              goto LAB_001435fb;
                            }
                            testing::internal::
                            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)this_00);
                            uVar1 = *(uint *)(*(long *)(mock.vm._8_8_ + 8 + mock.vm._264_8_ * 0x18)
                                             + mock.cur_fn * 4);
                            local_30.ptr_._0_4_ = uVar1 & 0xff;
                            gtest_ar_.message_.ptr_._0_4_ = 0x13;
                            mock.cur_fn = mock.cur_fn + 1;
                            testing::internal::CmpHelperEQ<BcOp,BcOp>
                                      ((internal *)local_50,"bc_op(ins)","BC_NEQ_LN",
                                       (BcOp *)&local_30,(BcOp *)&gtest_ar_.message_);
                            if (local_50[0] == (internal)0x0) {
                              testing::Message::Message((Message *)&local_30);
                              if (gtest_ar._0_8_ == 0) {
                                pcVar2 = "";
                              }
                              else {
                                pcVar2 = *(char **)gtest_ar._0_8_;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                         "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                         ,0x307,pcVar2);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30);
                            }
                            else {
                              testing::internal::
                              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                             *)&gtest_ar);
                              gtest_ar_.message_.ptr_._0_1_ = (char)(uVar1 >> 8);
                              local_30.ptr_._0_4_ = 0;
                              testing::internal::CmpHelperEQ<unsigned_char,int>
                                        ((internal *)local_50,"bc_arg1(ins)","0",
                                         (uchar *)&gtest_ar_.message_,(int *)&local_30);
                              if (local_50[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&local_30);
                                if (gtest_ar._0_8_ == 0) {
                                  pcVar2 = "";
                                }
                                else {
                                  pcVar2 = *(char **)gtest_ar._0_8_;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                           "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                           ,0x307,pcVar2);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&gtest_ar_.message_,(Message *)&local_30)
                                ;
                              }
                              else {
                                testing::internal::
                                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                               *)&gtest_ar);
                                gtest_ar_.message_.ptr_._0_2_ = (short)(uVar1 >> 0x10);
                                local_30.ptr_._0_4_ = 1;
                                testing::internal::CmpHelperEQ<unsigned_short,int>
                                          ((internal *)local_50,"bc_arg16(ins)","1",
                                           (unsigned_short *)&gtest_ar_.message_,(int *)&local_30);
                                if (local_50[0] == (internal)0x0) {
                                  testing::Message::Message((Message *)&local_30);
                                  if (gtest_ar._0_8_ == 0) {
                                    pcVar2 = "";
                                  }
                                  else {
                                    pcVar2 = *(char **)gtest_ar._0_8_;
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                             "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                             ,0x307,pcVar2);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&gtest_ar_.message_,
                                             (Message *)&local_30);
                                }
                                else {
                                  testing::internal::
                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                 *)&gtest_ar);
                                  gtest_ar_.success_ = false;
                                  gtest_ar_._1_7_ = 0;
                                  bVar3 = mock.cur_fn <
                                          (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 +
                                                               mock.vm._264_8_ * 0x18);
                                  local_30.ptr_._0_4_ = CONCAT31(local_30.ptr_._1_3_,bVar3);
                                  if (!bVar3) {
                                    testing::Message::Message((Message *)&gtest_ar_.message_);
                                    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                              ((string *)local_50,(internal *)&local_30,
                                               (AssertionResult *)
                                               "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count",
                                               "false","true",in_R9);
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                               ,0x308,(char *)CONCAT71(local_50._1_7_,local_50[0]));
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&mock.cur_ins,
                                               (Message *)&gtest_ar_.message_);
                                    goto LAB_001435fb;
                                  }
                                  testing::internal::
                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                 *)this_00);
                                  uVar1 = *(uint *)(*(long *)(mock.vm._8_8_ + 8 +
                                                             mock.vm._264_8_ * 0x18) +
                                                   mock.cur_fn * 4);
                                  local_30.ptr_._0_4_ = uVar1 & 0xff;
                                  gtest_ar_.message_.ptr_._0_4_ = 0x1d;
                                  mock.cur_fn = mock.cur_fn + 1;
                                  testing::internal::CmpHelperEQ<BcOp,BcOp>
                                            ((internal *)local_50,"bc_op(ins)","BC_JMP",
                                             (BcOp *)&local_30,(BcOp *)&gtest_ar_.message_);
                                  if (local_50[0] == (internal)0x0) {
                                    testing::Message::Message((Message *)&local_30);
                                    if (gtest_ar._0_8_ == 0) {
                                      pcVar2 = "";
                                    }
                                    else {
                                      pcVar2 = *(char **)gtest_ar._0_8_;
                                    }
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                               ,0x308,pcVar2);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&gtest_ar_.message_,
                                               (Message *)&local_30);
                                  }
                                  else {
                                    testing::internal::
                                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                    local_30.ptr_._0_4_ = uVar1 >> 8;
                                    gtest_ar_.message_.ptr_._0_4_ = 0x800002;
                                    testing::internal::CmpHelperEQ<unsigned_int,int>
                                              ((internal *)local_50,"bc_arg24(ins)",
                                               "0x800000 + 3 - 1",(uint *)&local_30,
                                               (int *)&gtest_ar_.message_);
                                    if (local_50[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)&local_30);
                                      if (gtest_ar._0_8_ == 0) {
                                        pcVar2 = "";
                                      }
                                      else {
                                        pcVar2 = *(char **)gtest_ar._0_8_;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&gtest_ar_.message_,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                 ,0x308,pcVar2);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&gtest_ar_.message_,
                                                 (Message *)&local_30);
                                    }
                                    else {
                                      testing::internal::
                                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                      gtest_ar_.success_ = false;
                                      gtest_ar_._1_7_ = 0;
                                      bVar3 = mock.cur_fn <
                                              (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 +
                                                                   mock.vm._264_8_ * 0x18);
                                      local_30.ptr_._0_4_ = CONCAT31(local_30.ptr_._1_3_,bVar3);
                                      if (!bVar3) {
                                        testing::Message::Message((Message *)&gtest_ar_.message_);
                                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                  ((string *)local_50,(internal *)&local_30,
                                                   (AssertionResult *)
                                                                                                      
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&mock.cur_ins,kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x309,(char *)CONCAT71(local_50._1_7_,local_50[0]
                                                                         ));
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&mock.cur_ins,
                                                   (Message *)&gtest_ar_.message_);
                                        goto LAB_001435fb;
                                      }
                                      testing::internal::
                                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)this_00);
                                      uVar1 = *(uint *)(*(long *)(mock.vm._8_8_ + 8 +
                                                                 mock.vm._264_8_ * 0x18) +
                                                       mock.cur_fn * 4);
                                      local_30.ptr_._0_4_ = uVar1 & 0xff;
                                      gtest_ar_.message_.ptr_._0_4_ = 1;
                                      mock.cur_fn = mock.cur_fn + 1;
                                      testing::internal::CmpHelperEQ<BcOp,BcOp>
                                                ((internal *)local_50,"bc_op(ins)","BC_SET_N",
                                                 (BcOp *)&local_30,(BcOp *)&gtest_ar_.message_);
                                      if (local_50[0] == (internal)0x0) {
                                        testing::Message::Message((Message *)&local_30);
                                        if (gtest_ar._0_8_ == 0) {
                                          pcVar2 = "";
                                        }
                                        else {
                                          pcVar2 = *(char **)gtest_ar._0_8_;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&gtest_ar_.message_,kFatalFailure
                                                   ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x309,pcVar2);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&gtest_ar_.message_,
                                                   (Message *)&local_30);
                                      }
                                      else {
                                        testing::internal::
                                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                        gtest_ar_.message_.ptr_._0_1_ = (char)(uVar1 >> 8);
                                        local_30.ptr_._0_4_ = 1;
                                        testing::internal::CmpHelperEQ<unsigned_char,int>
                                                  ((internal *)local_50,"bc_arg1(ins)","1",
                                                   (uchar *)&gtest_ar_.message_,(int *)&local_30);
                                        if (local_50[0] == (internal)0x0) {
                                          testing::Message::Message((Message *)&local_30);
                                          if (gtest_ar._0_8_ == 0) {
                                            pcVar2 = "";
                                          }
                                          else {
                                            pcVar2 = *(char **)gtest_ar._0_8_;
                                          }
                                          testing::internal::AssertHelper::AssertHelper
                                                    ((AssertHelper *)&gtest_ar_.message_,
                                                     kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x309,pcVar2);
                                          testing::internal::AssertHelper::operator=
                                                    ((AssertHelper *)&gtest_ar_.message_,
                                                     (Message *)&local_30);
                                        }
                                        else {
                                          testing::internal::
                                          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                          gtest_ar_.message_.ptr_._0_2_ = (short)(uVar1 >> 0x10);
                                          local_30.ptr_._0_4_ = 2;
                                          testing::internal::CmpHelperEQ<unsigned_short,int>
                                                    ((internal *)local_50,"bc_arg16(ins)","2",
                                                     (unsigned_short *)&gtest_ar_.message_,
                                                     (int *)&local_30);
                                          if (local_50[0] == (internal)0x0) {
                                            testing::Message::Message((Message *)&local_30);
                                            if (gtest_ar._0_8_ == 0) {
                                              pcVar2 = "";
                                            }
                                            else {
                                              pcVar2 = *(char **)gtest_ar._0_8_;
                                            }
                                            testing::internal::AssertHelper::AssertHelper
                                                      ((AssertHelper *)&gtest_ar_.message_,
                                                       kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x309,pcVar2);
                                            testing::internal::AssertHelper::operator=
                                                      ((AssertHelper *)&gtest_ar_.message_,
                                                       (Message *)&local_30);
                                          }
                                          else {
                                            testing::internal::
                                            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                            gtest_ar_.success_ = false;
                                            gtest_ar_._1_7_ = 0;
                                            bVar3 = mock.cur_fn <
                                                    (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 +
                                                                         mock.vm._264_8_ * 0x18);
                                            local_30.ptr_._0_4_ =
                                                 CONCAT31(local_30.ptr_._1_3_,bVar3);
                                            if (!bVar3) {
                                              testing::Message::Message
                                                        ((Message *)&gtest_ar_.message_);
                                              testing::internal::
                                              GetBoolAssertionFailureMessage_abi_cxx11_
                                                        ((string *)local_50,(internal *)&local_30,
                                                         (AssertionResult *)
                                                                                                                  
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                              testing::internal::AssertHelper::AssertHelper
                                                        ((AssertHelper *)&mock.cur_ins,kFatalFailure
                                                         ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x30a,(char *)CONCAT71(local_50._1_7_,local_50[0]
                                                                         ));
                                              testing::internal::AssertHelper::operator=
                                                        ((AssertHelper *)&mock.cur_ins,
                                                         (Message *)&gtest_ar_.message_);
                                              goto LAB_001435fb;
                                            }
                                            testing::internal::
                                            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)this_00);
                                            uVar1 = *(uint *)(*(long *)(mock.vm._8_8_ + 8 +
                                                                       mock.vm._264_8_ * 0x18) +
                                                             mock.cur_fn * 4);
                                            local_30.ptr_._0_4_ = uVar1 & 0xff;
                                            gtest_ar_.message_.ptr_._0_4_ = 0x1d;
                                            mock.cur_fn = mock.cur_fn + 1;
                                            testing::internal::CmpHelperEQ<BcOp,BcOp>
                                                      ((internal *)local_50,"bc_op(ins)","BC_JMP",
                                                       (BcOp *)&local_30,(BcOp *)&gtest_ar_.message_
                                                      );
                                            if (local_50[0] == (internal)0x0) {
                                              testing::Message::Message((Message *)&local_30);
                                              if (gtest_ar._0_8_ == 0) {
                                                pcVar2 = "";
                                              }
                                              else {
                                                pcVar2 = *(char **)gtest_ar._0_8_;
                                              }
                                              testing::internal::AssertHelper::AssertHelper
                                                        ((AssertHelper *)&gtest_ar_.message_,
                                                         kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x30a,pcVar2);
                                              testing::internal::AssertHelper::operator=
                                                        ((AssertHelper *)&gtest_ar_.message_,
                                                         (Message *)&local_30);
                                            }
                                            else {
                                              testing::internal::
                                              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                              local_30.ptr_._0_4_ = uVar1 >> 8;
                                              gtest_ar_.message_.ptr_._0_4_ = 0x800001;
                                              testing::internal::CmpHelperEQ<unsigned_int,int>
                                                        ((internal *)local_50,"bc_arg24(ins)",
                                                         "0x800000 + 2 - 1",(uint *)&local_30,
                                                         (int *)&gtest_ar_.message_);
                                              if (local_50[0] == (internal)0x0) {
                                                testing::Message::Message((Message *)&local_30);
                                                if (gtest_ar._0_8_ == 0) {
                                                  pcVar2 = "";
                                                }
                                                else {
                                                  pcVar2 = *(char **)gtest_ar._0_8_;
                                                }
                                                testing::internal::AssertHelper::AssertHelper
                                                          ((AssertHelper *)&gtest_ar_.message_,
                                                           kFatalFailure,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x30a,pcVar2);
                                                testing::internal::AssertHelper::operator=
                                                          ((AssertHelper *)&gtest_ar_.message_,
                                                           (Message *)&local_30);
                                              }
                                              else {
                                                testing::internal::
                                                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                                gtest_ar_.success_ = false;
                                                gtest_ar_._1_7_ = 0;
                                                bVar3 = mock.cur_fn <
                                                        (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10 +
                                                                             mock.vm._264_8_ * 0x18)
                                                ;
                                                local_30.ptr_._0_4_ =
                                                     CONCAT31(local_30.ptr_._1_3_,bVar3);
                                                if (!bVar3) {
                                                  testing::Message::Message
                                                            ((Message *)&gtest_ar_.message_);
                                                  testing::internal::
                                                  GetBoolAssertionFailureMessage_abi_cxx11_
                                                            ((string *)local_50,
                                                             (internal *)&local_30,
                                                             (AssertionResult *)
                                                                                                                          
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&mock.cur_ins,
                                                             kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x30b,(char *)CONCAT71(local_50._1_7_,local_50[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&mock.cur_ins,
                                                             (Message *)&gtest_ar_.message_);
                                                  goto LAB_001435fb;
                                                }
                                                testing::internal::
                                                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)this_00);
                                                uVar1 = *(uint *)(*(long *)(mock.vm._8_8_ + 8 +
                                                                           mock.vm._264_8_ * 0x18) +
                                                                 mock.cur_fn * 4);
                                                local_30.ptr_._0_4_ = uVar1 & 0xff;
                                                gtest_ar_.message_.ptr_._0_4_ = 1;
                                                mock.cur_fn = mock.cur_fn + 1;
                                                testing::internal::CmpHelperEQ<BcOp,BcOp>
                                                          ((internal *)local_50,"bc_op(ins)",
                                                           "BC_SET_N",(BcOp *)&local_30,
                                                           (BcOp *)&gtest_ar_.message_);
                                                if (local_50[0] == (internal)0x0) {
                                                  testing::Message::Message((Message *)&local_30);
                                                  if (gtest_ar._0_8_ == 0) {
                                                    pcVar2 = "";
                                                  }
                                                  else {
                                                    pcVar2 = *(char **)gtest_ar._0_8_;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x30b,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_30);
                                                }
                                                else {
                                                  testing::internal::
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                                  gtest_ar_.message_.ptr_._0_1_ = (char)(uVar1 >> 8)
                                                  ;
                                                  local_30.ptr_._0_4_ = 1;
                                                  testing::internal::CmpHelperEQ<unsigned_char,int>
                                                            ((internal *)local_50,"bc_arg1(ins)","1"
                                                             ,(uchar *)&gtest_ar_.message_,
                                                             (int *)&local_30);
                                                  if (local_50[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_30);
                                                    if (gtest_ar._0_8_ == 0) {
                                                      pcVar2 = "";
                                                    }
                                                    else {
                                                      pcVar2 = *(char **)gtest_ar._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x30b,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_30);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                                  gtest_ar_.message_.ptr_._0_2_ =
                                                       (short)(uVar1 >> 0x10);
                                                  local_30.ptr_._0_4_ = 3;
                                                  testing::internal::CmpHelperEQ<unsigned_short,int>
                                                            ((internal *)local_50,"bc_arg16(ins)",
                                                             "3",(unsigned_short *)
                                                                 &gtest_ar_.message_,
                                                             (int *)&local_30);
                                                  if (local_50[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_30);
                                                    if (gtest_ar._0_8_ == 0) {
                                                      pcVar2 = "";
                                                    }
                                                    else {
                                                      pcVar2 = *(char **)gtest_ar._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x30b,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_30);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  bVar3 = mock.cur_fn <
                                                          (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10
                                                                               + mock.vm._264_8_ *
                                                                                 0x18);
                                                  local_30.ptr_._0_4_ =
                                                       CONCAT31(local_30.ptr_._1_3_,bVar3);
                                                  if (!bVar3) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_50,
                                                               (internal *)&local_30,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&mock.cur_ins,
                                                             kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x30d,(char *)CONCAT71(local_50._1_7_,local_50[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&mock.cur_ins,
                                                             (Message *)&gtest_ar_.message_);
                                                  goto LAB_001435fb;
                                                  }
                                                  testing::internal::
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)this_00);
                                                  uVar1 = *(uint *)(*(long *)(mock.vm._8_8_ + 8 +
                                                                             mock.vm._264_8_ * 0x18)
                                                                   + mock.cur_fn * 4);
                                                  local_30.ptr_._0_4_ = uVar1 & 0xff;
                                                  gtest_ar_.message_.ptr_._0_4_ = 1;
                                                  mock.cur_fn = mock.cur_fn + 1;
                                                  testing::internal::CmpHelperEQ<BcOp,BcOp>
                                                            ((internal *)local_50,"bc_op(ins)",
                                                             "BC_SET_N",(BcOp *)&local_30,
                                                             (BcOp *)&gtest_ar_.message_);
                                                  if (local_50[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_30);
                                                    if (gtest_ar._0_8_ == 0) {
                                                      pcVar2 = "";
                                                    }
                                                    else {
                                                      pcVar2 = *(char **)gtest_ar._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x30d,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_30);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                                  gtest_ar_.message_.ptr_._0_1_ = (char)(uVar1 >> 8)
                                                  ;
                                                  local_30.ptr_._0_4_ = 1;
                                                  testing::internal::CmpHelperEQ<unsigned_char,int>
                                                            ((internal *)local_50,"bc_arg1(ins)","1"
                                                             ,(uchar *)&gtest_ar_.message_,
                                                             (int *)&local_30);
                                                  if (local_50[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_30);
                                                    if (gtest_ar._0_8_ == 0) {
                                                      pcVar2 = "";
                                                    }
                                                    else {
                                                      pcVar2 = *(char **)gtest_ar._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x30d,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_30);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                                  gtest_ar_.message_.ptr_._0_2_ =
                                                       (short)(uVar1 >> 0x10);
                                                  local_30.ptr_._0_4_ = 4;
                                                  testing::internal::CmpHelperEQ<unsigned_short,int>
                                                            ((internal *)local_50,"bc_arg16(ins)",
                                                             "4",(unsigned_short *)
                                                                 &gtest_ar_.message_,
                                                             (int *)&local_30);
                                                  if (local_50[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_30);
                                                    if (gtest_ar._0_8_ == 0) {
                                                      pcVar2 = "";
                                                    }
                                                    else {
                                                      pcVar2 = *(char **)gtest_ar._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x30d,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_30);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                                  gtest_ar_.success_ = false;
                                                  gtest_ar_._1_7_ = 0;
                                                  bVar3 = mock.cur_fn <
                                                          (ulong)(long)*(int *)(mock.vm._8_8_ + 0x10
                                                                               + mock.vm._264_8_ *
                                                                                 0x18);
                                                  local_30.ptr_._0_4_ =
                                                       CONCAT31(local_30.ptr_._1_3_,bVar3);
                                                  if (!bVar3) {
                                                    testing::Message::Message
                                                              ((Message *)&gtest_ar_.message_);
                                                    testing::internal::
                                                    GetBoolAssertionFailureMessage_abi_cxx11_
                                                              ((string *)local_50,
                                                               (internal *)&local_30,
                                                               (AssertionResult *)
                                                                                                                              
                                                  "mock.cur_ins < mock.vm.fns[mock.cur_fn].ins_count"
                                                  ,"false","true",in_R9);
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&mock.cur_ins,
                                                             kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x30f,(char *)CONCAT71(local_50._1_7_,local_50[0]
                                                                         ));
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&mock.cur_ins,
                                                             (Message *)&gtest_ar_.message_);
                                                  goto LAB_001435fb;
                                                  }
                                                  testing::internal::
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)this_00);
                                                  uVar1 = *(uint *)(*(long *)(mock.vm._8_8_ + 8 +
                                                                             mock.vm._264_8_ * 0x18)
                                                                   + mock.cur_fn * 4);
                                                  local_30.ptr_._0_4_ = uVar1 & 0xff;
                                                  gtest_ar_.message_.ptr_._0_4_ = 0x20;
                                                  mock.cur_fn = mock.cur_fn + 1;
                                                  testing::internal::CmpHelperEQ<BcOp,BcOp>
                                                            ((internal *)local_50,"bc_op(ins)",
                                                             "BC_RET",(BcOp *)&local_30,
                                                             (BcOp *)&gtest_ar_.message_);
                                                  if (local_50[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_30);
                                                    if (gtest_ar._0_8_ == 0) {
                                                      pcVar2 = "";
                                                    }
                                                    else {
                                                      pcVar2 = *(char **)gtest_ar._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x30f,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_30);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                                  gtest_ar_.message_.ptr_._0_1_ = (char)(uVar1 >> 8)
                                                  ;
                                                  local_30.ptr_._0_4_ = 0;
                                                  testing::internal::CmpHelperEQ<unsigned_char,int>
                                                            ((internal *)local_50,"bc_arg1(ins)","0"
                                                             ,(uchar *)&gtest_ar_.message_,
                                                             (int *)&local_30);
                                                  if (local_50[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_30);
                                                    if (gtest_ar._0_8_ == 0) {
                                                      pcVar2 = "";
                                                    }
                                                    else {
                                                      pcVar2 = *(char **)gtest_ar._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x30f,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_30);
                                                  }
                                                  else {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                                  gtest_ar_.message_.ptr_._0_1_ =
                                                       (char)(uVar1 >> 0x10);
                                                  local_30.ptr_._0_4_ = 0;
                                                  testing::internal::CmpHelperEQ<unsigned_char,int>
                                                            ((internal *)local_50,"bc_arg2(ins)","0"
                                                             ,(uchar *)&gtest_ar_.message_,
                                                             (int *)&local_30);
                                                  if (local_50[0] != (internal)0x0) {
                                                    testing::internal::
                                                                                                        
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr((
                                                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&gtest_ar);
                                                  gtest_ar_.message_.ptr_._0_1_ =
                                                       (char)(uVar1 >> 0x18);
                                                  local_30.ptr_._0_4_ = 0;
                                                  testing::internal::CmpHelperEQ<unsigned_char,int>
                                                            ((internal *)local_50,"bc_arg3(ins)","0"
                                                             ,(uchar *)&gtest_ar_.message_,
                                                             (int *)&local_30);
                                                  if (local_50[0] == (internal)0x0) {
                                                    testing::Message::Message((Message *)&local_30);
                                                    if (gtest_ar._0_8_ == 0) {
                                                      pcVar2 = "";
                                                    }
                                                    else {
                                                      pcVar2 = *(char **)gtest_ar._0_8_;
                                                    }
                                                    testing::internal::AssertHelper::AssertHelper
                                                              ((AssertHelper *)&gtest_ar_.message_,
                                                               kFatalFailure,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x30f,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_30);
                                                  testing::internal::AssertHelper::~AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_);
                                                  testing::internal::
                                                  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::~scoped_ptr(&local_30);
                                                  }
                                                  this_00 = &gtest_ar;
                                                  goto LAB_0014376a;
                                                  }
                                                  testing::Message::Message((Message *)&local_30);
                                                  if (gtest_ar._0_8_ == 0) {
                                                    pcVar2 = "";
                                                  }
                                                  else {
                                                    pcVar2 = *(char **)gtest_ar._0_8_;
                                                  }
                                                  testing::internal::AssertHelper::AssertHelper
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             kFatalFailure,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
                                                  ,0x30f,pcVar2);
                                                  testing::internal::AssertHelper::operator=
                                                            ((AssertHelper *)&gtest_ar_.message_,
                                                             (Message *)&local_30);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  this_00 = &gtest_ar;
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_30);
LAB_0014376a:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this_00);
  MockParser::~MockParser((MockParser *)local_178);
  return;
}

Assistant:

TEST(If, IfElseifElse) {
	MockParser mock(
		"let a = 3\n"
		"if a == 3 {\n"
		"  let b = 4\n"
		"} elseif a == 4 {\n"
		"  let b = 5\n"
		"} else {\n"
		"  let b = 6\n"
		"}\n"
		"let c = 7\n"
	);

	INS2(BC_SET_N, 0, 0);

	INS2(BC_NEQ_LN, 0, 0); // If condition
	JMP(3); // Jump to elseif condition
	INS2(BC_SET_N, 1, 1); // If body
	JMP(6); // Jump to after
	INS2(BC_NEQ_LN, 0, 1); // Elseif condition
	JMP(3);
	INS2(BC_SET_N, 1, 2); // Elseif body
	JMP(2); // Jump to after
	INS2(BC_SET_N, 1, 3); // Else body

	INS2(BC_SET_N, 1, 4); // After

	INS(BC_RET, 0, 0, 0);
}